

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O2

void __thiscall ECDSAAdaptor_Adapt_Test::TestBody(ECDSAAdaptor_Adapt_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  string local_88;
  string local_68;
  ByteData sig;
  ByteData raw_sig;
  SigHashType sig_hash;
  
  cfd::core::SigHashType::SigHashType(&sig_hash);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&raw_sig,&sig_der,&sig_hash);
  cfd::core::AdaptorUtil::Adapt(&sig,&adaptor_sig2,&secret);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_68,&raw_sig);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_88,&sig);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"raw_sig.GetHex()","sig.GetHex()",&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&raw_sig);
  return;
}

Assistant:

TEST(ECDSAAdaptor, Adapt) {
  SigHashType sig_hash;
  auto raw_sig = CryptoUtil::ConvertSignatureFromDer(sig_der, &sig_hash);
  auto sig = AdaptorUtil::Adapt(adaptor_sig2, secret);

  EXPECT_EQ(raw_sig.GetHex(), sig.GetHex());
}